

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TempTracker.cpp
# Opt level: O1

void __thiscall ObjectTempVerify::MergeDeadData(ObjectTempVerify *this,BasicBlock *block)

{
  BVSparse<Memory::JitArenaAllocator> *this_00;
  
  this_00 = &this->removedUpwardExposedUse;
  BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
            (this_00,&(block->tempObjectVerifyTracker->super_ObjectTempVerify).
                      removedUpwardExposedUse);
  if ((block->field_0x18 & 2) == 0) {
    BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
              (this_00,block->upwardExposedUses);
    if (block->byteCodeUpwardExposedUsed != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
      BVSparse<Memory::JitArenaAllocator>::for_each<&BVUnitT<unsigned_long>::Or>
                (this_00,block->byteCodeUpwardExposedUsed);
      return;
    }
  }
  return;
}

Assistant:

void
ObjectTempVerify::MergeDeadData(BasicBlock * block)
{
    MergeData(block->tempObjectVerifyTracker, false);
    if (!block->isDead)
    {
        // If there was dead flow to a block that is not dead, it might expose
        // new mark temp object, so all its current used (upwardExposedUsed) and optimized
        // use (byteCodeupwardExposedUsed) might not be trace for "missed" mark temp object
        this->removedUpwardExposedUse.Or(block->upwardExposedUses);
        if (block->byteCodeUpwardExposedUsed)
        {
            this->removedUpwardExposedUse.Or(block->byteCodeUpwardExposedUsed);
        }
    }
}